

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElDisc.cpp
# Opt level: O3

void __thiscall
TPZCompElDisc::TPZCompElDisc
          (TPZCompElDisc *this,TPZCompMesh *mesh,TPZCompElDisc *copy,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcConMap,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcElMap)

{
  ulong uVar1;
  double *pdVar2;
  mapped_type_conflict mVar3;
  TPZReference *pTVar4;
  TPZReference *pTVar5;
  double *pdVar6;
  mapped_type_conflict *pmVar7;
  long *plVar8;
  TPZIntPoints *rval;
  ulong uVar9;
  TPZAutoPointer<TPZFunction<double>_> local_38;
  
  *(undefined ***)&(this->super_TPZInterpolationSpace).super_TPZCompEl = &PTR__TPZSavable_01945230;
  TPZInterpolationSpace::TPZInterpolationSpace
            (&this->super_TPZInterpolationSpace,&PTR_PTR_01944b78,mesh,
             &copy->super_TPZInterpolationSpace);
  *(undefined ***)&(this->super_TPZInterpolationSpace).super_TPZCompEl =
       &PTR__TPZCompElDisc_01944808;
  pTVar4 = (TPZReference *)operator_new(0x10);
  (pTVar4->fCounter).super___atomic_base<int>._M_i = 0;
  pTVar4->fPointer = (TPZIntPoints *)0x0;
  LOCK();
  (pTVar4->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  (this->fIntRule).fRef = pTVar4;
  this->fConnectIndex = -1;
  pTVar5 = (TPZReference *)operator_new(0x10);
  (pTVar5->fCounter).super___atomic_base<int>._M_i = 0;
  pTVar5->fPointer = (TPZFunction<double> *)0x0;
  LOCK();
  (pTVar5->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  (this->fExternalShape).fRef = pTVar5;
  (this->fCenterPoint).super_TPZVec<double>.fStore = (double *)0x0;
  (this->fCenterPoint).super_TPZVec<double>.fNElements = 0;
  (this->fCenterPoint).super_TPZVec<double>.fNAlloc = 0;
  (this->fCenterPoint).super_TPZVec<double>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01819f98
  ;
  uVar1 = (copy->fCenterPoint).super_TPZVec<double>.fNElements;
  if ((long)uVar1 < 4) {
    pdVar6 = (this->fCenterPoint).fExtAlloc;
    (this->fCenterPoint).super_TPZVec<double>.fStore = pdVar6;
    (this->fCenterPoint).super_TPZVec<double>.fNElements = uVar1;
    (this->fCenterPoint).super_TPZVec<double>.fNAlloc = 0;
    if ((long)uVar1 < 1) goto LAB_011f8dfe;
  }
  else {
    pdVar6 = (double *)operator_new__(-(ulong)(uVar1 >> 0x3d != 0) | uVar1 * 8);
    (this->fCenterPoint).super_TPZVec<double>.fStore = pdVar6;
    (this->fCenterPoint).super_TPZVec<double>.fNElements = uVar1;
    (this->fCenterPoint).super_TPZVec<double>.fNAlloc = uVar1;
  }
  pdVar2 = (copy->fCenterPoint).super_TPZVec<double>.fStore;
  uVar9 = 0;
  do {
    pdVar6[uVar9] = pdVar2[uVar9];
    uVar9 = uVar9 + 1;
  } while (uVar1 != uVar9);
LAB_011f8dfe:
  this->fShapefunctionType = copy->fShapefunctionType;
  mVar3 = (copy->super_TPZInterpolationSpace).super_TPZCompEl.fIndex;
  pmVar7 = std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
           operator[](gl2lcElMap,&(this->super_TPZInterpolationSpace).super_TPZCompEl.fIndex);
  *pmVar7 = mVar3;
  pTVar4 = (copy->fIntRule).fRef;
  if ((pTVar4 == (TPZReference *)0x0) || (pTVar4->fPointer == (TPZIntPoints *)0x0)) {
    rval = (TPZIntPoints *)0x0;
  }
  else {
    plVar8 = (long *)(**(code **)(*(long *)&(copy->super_TPZInterpolationSpace).super_TPZCompEl +
                                 0x240))(copy);
    rval = (TPZIntPoints *)(**(code **)(*plVar8 + 0x48))(plVar8);
  }
  TPZAutoPointer<TPZIntPoints>::operator=(&this->fIntRule,rval);
  local_38.fRef = (copy->fExternalShape).fRef;
  LOCK();
  ((local_38.fRef)->fCounter).super___atomic_base<int>._M_i =
       ((local_38.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  SetExternalShapeFunction(this,&local_38);
  TPZAutoPointer<TPZFunction<double>_>::~TPZAutoPointer(&local_38);
  this->fUseQsiEta = copy->fUseQsiEta;
  return;
}

Assistant:

TPZCompElDisc::TPZCompElDisc(TPZCompMesh &mesh,
                             const TPZCompElDisc &copy,
                             std::map<int64_t,int64_t> &gl2lcConMap,
                             std::map<int64_t,int64_t> &gl2lcElMap) : 
TPZRegisterClassId(&TPZCompElDisc::ClassId),TPZInterpolationSpace(mesh,copy), fConnectIndex(-1), fCenterPoint(copy.fCenterPoint)
{
	fShapefunctionType = copy.fShapefunctionType;
	//TPZMaterial * mat = copy.Material();
	gl2lcElMap[this->fIndex] = copy.fIndex;
	
	if (copy.fIntRule){
		this->fIntRule = copy.GetIntegrationRule().Clone();
	}
	else{
		this->fIntRule = NULL;
	}
	
	this->SetExternalShapeFunction(copy.fExternalShape);
    fUseQsiEta = copy.fUseQsiEta;
}